

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

int anon_unknown.dwarf_aef201::cmFileUploadProgressCallback
              (void *clientp,cm_curl_off_t dltotal,cm_curl_off_t dlnow,cm_curl_off_t ultotal,
              cm_curl_off_t ulnow)

{
  bool bVar1;
  string status;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar1 = cURLProgressHelper::UpdatePercentage
                    ((cURLProgressHelper *)clientp,ulnow,ultotal,&local_28);
  if (bVar1) {
    cmMakefile::DisplayStatus(*(cmMakefile **)((long)clientp + 8),&local_28,-1.0);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int cmFileUploadProgressCallback(void* clientp, cm_curl_off_t dltotal,
                                 cm_curl_off_t dlnow, cm_curl_off_t ultotal,
                                 cm_curl_off_t ulnow)
{
  cURLProgressHelper* helper = reinterpret_cast<cURLProgressHelper*>(clientp);

  static_cast<void>(dltotal);
  static_cast<void>(dlnow);

  std::string status;
  if (helper->UpdatePercentage(ulnow, ultotal, status)) {
    cmMakefile* mf = helper->GetMakefile();
    mf->DisplayStatus(status, -1);
  }

  return 0;
}